

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void * canvas_undo_set_paste(_glist *x,int numpasted,int duplicate,int d_offset)

{
  int iVar1;
  int *piVar2;
  _binbuf *p_Var3;
  t_undo_paste *buf;
  int d_offset_local;
  int duplicate_local;
  int numpasted_local;
  _glist *x_local;
  
  piVar2 = (int *)getbytes(0x18);
  iVar1 = glist_getindex(x,(t_gobj *)0x0);
  *piVar2 = iVar1 - numpasted;
  if (((duplicate == 0) && (x->gl_editor->e_selection != (t_selection *)0x0)) &&
     (x->gl_editor->e_selection->sel_next == (_selection *)0x0)) {
    iVar1 = glist_getindex(x,x->gl_editor->e_selection->sel_what);
    piVar2[1] = iVar1;
  }
  else {
    piVar2[1] = -1;
  }
  piVar2[2] = d_offset;
  p_Var3 = binbuf_duplicate(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
  *(_binbuf **)(piVar2 + 4) = p_Var3;
  return piVar2;
}

Assistant:

void *canvas_undo_set_paste(t_canvas *x, int numpasted, int duplicate,
    int d_offset)
{
    t_undo_paste *buf =  (t_undo_paste *)getbytes(sizeof(*buf));
    buf->u_index = glist_getindex(x, 0) - numpasted; /* do we need numpasted at all? */
    if (!duplicate && x->gl_editor->e_selection &&
        !x->gl_editor->e_selection->sel_next)
    {
            /* if only one object is selected which will warrant autopatching */
        buf->u_sel_index = glist_getindex(x,
            x->gl_editor->e_selection->sel_what);
    }
    else
    {
        buf->u_sel_index = -1;
    }
    buf->u_offset = d_offset;
    buf->u_objectbuf = binbuf_duplicate(EDITOR->copy_binbuf);
    return (buf);
}